

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O2

int stbtt_FindGlyphIndex(stbtt_fontinfo *info,int unicode_codepoint)

{
  uint uVar1;
  uchar *puVar2;
  stbtt_uint32 sVar3;
  ushort uVar4;
  stbtt_uint32 sVar5;
  stbtt_uint32 sVar6;
  stbtt_uint32 sVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ushort uVar11;
  ushort uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  stbtt_uint8 *p;
  uint uVar17;
  bool bVar18;
  
  puVar2 = info->data;
  uVar1 = info->index_map;
  uVar8 = (ulong)uVar1;
  uVar4 = *(ushort *)(puVar2 + uVar8) << 8;
  uVar12 = *(ushort *)(puVar2 + uVar8) >> 8;
  uVar11 = uVar4 | uVar12;
  switch(uVar11) {
  case 0:
    if (unicode_codepoint <
        (int)((ushort)(*(ushort *)(puVar2 + uVar8 + 2) << 8 | *(ushort *)(puVar2 + uVar8 + 2) >> 8)
             - 6)) {
      return (uint)puVar2[(long)unicode_codepoint + uVar8 + 6];
    }
    break;
  default:
    if ((uVar4 | uVar12 & 0xfffe) != 0xc) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imstb_truetype.h"
                    ,0x636,"int stbtt_FindGlyphIndex(const stbtt_fontinfo *, int)");
    }
    sVar5 = ttULONG(puVar2 + uVar8 + 0xc);
    iVar16 = 0;
    while (sVar3 = sVar5, sVar3 - iVar16 != 0 && iVar16 <= (int)sVar3) {
      sVar5 = ((int)(sVar3 - iVar16) >> 1) + iVar16;
      p = puVar2 + (long)(int)(sVar5 * 0xc) + uVar8 + 0x10;
      sVar6 = ttULONG(p);
      if (sVar6 <= (uint)unicode_codepoint) {
        sVar7 = ttULONG(p + 4);
        if ((uint)unicode_codepoint <= sVar7) {
          sVar5 = ttULONG(p + 8);
          iVar16 = 0;
          if (uVar11 == 0xc) {
            iVar16 = unicode_codepoint - sVar6;
          }
          return iVar16 + sVar5;
        }
        iVar16 = sVar5 + 1;
        sVar5 = sVar3;
      }
    }
    break;
  case 2:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imstb_truetype.h"
                  ,0x5ef,"int stbtt_FindGlyphIndex(const stbtt_fontinfo *, int)");
  case 4:
    if (unicode_codepoint < 0x10000) {
      uVar4 = *(ushort *)(puVar2 + uVar8 + 6) << 8 | *(ushort *)(puVar2 + uVar8 + 6) >> 8;
      uVar12 = *(ushort *)(puVar2 + uVar8 + 10) << 8 | *(ushort *)(puVar2 + uVar8 + 10) >> 8;
      uVar13 = (uint)(ushort)(*(ushort *)(puVar2 + uVar8 + 8) << 8 |
                             *(ushort *)(puVar2 + uVar8 + 8) >> 8);
      uVar15 = (ulong)(puVar2[uVar8 + 0xd] & 0xfffffffe) | (ulong)puVar2[uVar8 + 0xc] << 8;
      if (unicode_codepoint <
          (int)(uint)(ushort)(*(ushort *)(puVar2 + uVar15 + (uVar1 + 0xe)) << 8 |
                             *(ushort *)(puVar2 + uVar15 + (uVar1 + 0xe)) >> 8)) {
        uVar15 = 0;
      }
      uVar17 = uVar1 + (int)uVar15 + 0xc;
      while (bVar18 = uVar12 != 0, uVar12 = uVar12 - 1, bVar18) {
        uVar13 = uVar13 >> 1;
        uVar14 = uVar13 & 0xfffffffe;
        if (unicode_codepoint <=
            (int)(uint)(ushort)(*(ushort *)(puVar2 + (ulong)uVar14 + (ulong)uVar17) << 8 |
                               *(ushort *)(puVar2 + (ulong)uVar14 + (ulong)uVar17) >> 8)) {
          uVar14 = 0;
        }
        uVar17 = uVar14 + uVar17;
      }
      uVar15 = (ulong)((uVar17 - uVar1) + 0x1fff4 & 0x1fffe);
      uVar17 = (uint)(ushort)(*(ushort *)(puVar2 + uVar15 + (uVar4 & 0xfffffffe) + uVar8 + 0x10) <<
                              8 | *(ushort *)(puVar2 + uVar15 + (uVar4 & 0xfffffffe) + uVar8 + 0x10)
                                  >> 8);
      uVar13 = 0;
      if (((int)uVar17 <= unicode_codepoint) &&
         (uVar13 = 0,
         unicode_codepoint <=
         (int)(uint)(ushort)(*(ushort *)(puVar2 + uVar15 + (uVar1 + 0xe)) << 8 |
                            *(ushort *)(puVar2 + uVar15 + (uVar1 + 0xe)) >> 8))) {
        uVar10 = (ulong)(uVar4 >> 1);
        lVar9 = uVar10 * 6;
        uVar4 = *(ushort *)(puVar2 + uVar15 + 2 + lVar9 + uVar8 + 0xe) << 8 |
                *(ushort *)(puVar2 + uVar15 + 2 + lVar9 + uVar8 + 0xe) >> 8;
        if (uVar4 == 0) {
          uVar13 = (uint)(ushort)(*(ushort *)(puVar2 + uVar15 + 2 + uVar10 * 4 + uVar8 + 0xe) << 8 |
                                 *(ushort *)(puVar2 + uVar15 + 2 + uVar10 * 4 + uVar8 + 0xe) >> 8) +
                   unicode_codepoint;
        }
        else {
          uVar13 = (uint)(ushort)(*(ushort *)
                                   (puVar2 + uVar15 + 0x10 +
                                             uVar8 + lVar9 +
                                             (long)(int)((unicode_codepoint - uVar17) * 2) +
                                             (ulong)uVar4) << 8 |
                                 *(ushort *)
                                  (puVar2 + uVar15 + 0x10 +
                                            uVar8 + lVar9 +
                                            (long)(int)((unicode_codepoint - uVar17) * 2) +
                                            (ulong)uVar4) >> 8);
        }
      }
      return uVar13 & 0xffff;
    }
    break;
  case 6:
    uVar4 = *(ushort *)(puVar2 + uVar8 + 6) << 8 | *(ushort *)(puVar2 + uVar8 + 6) >> 8;
    if ((uint)unicode_codepoint < (uint)uVar4) {
      return 0;
    }
    if ((uint)(ushort)(*(ushort *)(puVar2 + uVar8 + 8) << 8 | *(ushort *)(puVar2 + uVar8 + 8) >> 8)
        + (uint)uVar4 <= (uint)unicode_codepoint) {
      return 0;
    }
    return (uint)(ushort)(*(ushort *)
                           (puVar2 + (ulong)((unicode_codepoint - (uint)uVar4) * 2) + uVar8 + 10) <<
                          8 | *(ushort *)
                               (puVar2 + (ulong)((unicode_codepoint - (uint)uVar4) * 2) + uVar8 + 10
                               ) >> 8);
  }
  return 0;
}

Assistant:

STBTT_DEF int stbtt_FindGlyphIndex(const stbtt_fontinfo *info, int unicode_codepoint)
{
   stbtt_uint8 *data = info->data;
   stbtt_uint32 index_map = info->index_map;

   stbtt_uint16 format = ttUSHORT(data + index_map + 0);
   if (format == 0) { // apple byte encoding
      stbtt_int32 bytes = ttUSHORT(data + index_map + 2);
      if (unicode_codepoint < bytes-6)
         return ttBYTE(data + index_map + 6 + unicode_codepoint);
      return 0;
   } else if (format == 6) {
      stbtt_uint32 first = ttUSHORT(data + index_map + 6);
      stbtt_uint32 count = ttUSHORT(data + index_map + 8);
      if ((stbtt_uint32) unicode_codepoint >= first && (stbtt_uint32) unicode_codepoint < first+count)
         return ttUSHORT(data + index_map + 10 + (unicode_codepoint - first)*2);
      return 0;
   } else if (format == 2) {
      STBTT_assert(0); // @TODO: high-byte mapping for japanese/chinese/korean
      return 0;
   } else if (format == 4) { // standard mapping for windows fonts: binary search collection of ranges
      stbtt_uint16 segcount = ttUSHORT(data+index_map+6) >> 1;
      stbtt_uint16 searchRange = ttUSHORT(data+index_map+8) >> 1;
      stbtt_uint16 entrySelector = ttUSHORT(data+index_map+10);
      stbtt_uint16 rangeShift = ttUSHORT(data+index_map+12) >> 1;

      // do a binary search of the segments
      stbtt_uint32 endCount = index_map + 14;
      stbtt_uint32 search = endCount;

      if (unicode_codepoint > 0xffff)
         return 0;

      // they lie from endCount .. endCount + segCount
      // but searchRange is the nearest power of two, so...
      if (unicode_codepoint >= ttUSHORT(data + search + rangeShift*2))
         search += rangeShift*2;

      // now decrement to bias correctly to find smallest
      search -= 2;
      while (entrySelector) {
         stbtt_uint16 end;
         searchRange >>= 1;
         end = ttUSHORT(data + search + searchRange*2);
         if (unicode_codepoint > end)
            search += searchRange*2;
         --entrySelector;
      }
      search += 2;

      {
         stbtt_uint16 offset, start, last;
         stbtt_uint16 item = (stbtt_uint16) ((search - endCount) >> 1);

         start = ttUSHORT(data + index_map + 14 + segcount*2 + 2 + 2*item);
         last = ttUSHORT(data + endCount + 2*item);
         if (unicode_codepoint < start || unicode_codepoint > last)
            return 0;

         offset = ttUSHORT(data + index_map + 14 + segcount*6 + 2 + 2*item);
         if (offset == 0)
            return (stbtt_uint16) (unicode_codepoint + ttSHORT(data + index_map + 14 + segcount*4 + 2 + 2*item));

         return ttUSHORT(data + offset + (unicode_codepoint-start)*2 + index_map + 14 + segcount*6 + 2 + 2*item);
      }
   } else if (format == 12 || format == 13) {
      stbtt_uint32 ngroups = ttULONG(data+index_map+12);
      stbtt_int32 low,high;
      low = 0; high = (stbtt_int32)ngroups;
      // Binary search the right group.
      while (low < high) {
         stbtt_int32 mid = low + ((high-low) >> 1); // rounds down, so low <= mid < high
         stbtt_uint32 start_char = ttULONG(data+index_map+16+mid*12);
         stbtt_uint32 end_char = ttULONG(data+index_map+16+mid*12+4);
         if ((stbtt_uint32) unicode_codepoint < start_char)
            high = mid;
         else if ((stbtt_uint32) unicode_codepoint > end_char)
            low = mid+1;
         else {
            stbtt_uint32 start_glyph = ttULONG(data+index_map+16+mid*12+8);
            if (format == 12)
               return start_glyph + unicode_codepoint-start_char;
            else // format == 13
               return start_glyph;
         }
      }
      return 0; // not found
   }
   // @TODO
   STBTT_assert(0);
   return 0;
}